

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

bool __thiscall dg::vr::RelationsAnalyzer::isSafe(RelationsAnalyzer *this,I inst)

{
  char cVar1;
  bool bVar2;
  ID id;
  ret_type this_00;
  Function *pFVar3;
  const_iterator cVar4;
  StringRef local_48;
  string local_38;
  
  cVar1 = llvm::Instruction::mayWriteToMemory();
  if ((cVar1 == '\0') && (cVar1 = llvm::Instruction::mayHaveSideEffects(), cVar1 == '\0')) {
    return true;
  }
  this_00 = llvm::dyn_cast<llvm::IntrinsicInst,llvm::Instruction_const>(inst);
  if (this_00 != (ret_type)0x0) {
    id = llvm::IntrinsicInst::getIntrinsicID(this_00);
    bVar2 = isIgnorableIntrinsic(id);
    if (bVar2) {
      return true;
    }
  }
  if ((inst[0x10] == (Instruction)0x53) &&
     (pFVar3 = llvm::CallBase::getCalledFunction((CallBase *)inst), pFVar3 != (Function *)0x0)) {
    local_48 = (StringRef)llvm::Value::getName();
    llvm::StringRef::str_abi_cxx11_(&local_38,&local_48);
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this,&local_38);
    std::__cxx11::string::_M_dispose();
    if (cVar4._M_node != (_Base_ptr)(this + 8)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool RelationsAnalyzer::isSafe(I inst) const {
    if (!inst->mayWriteToMemory() && !inst->mayHaveSideEffects())
        return true;

    if (const auto *intrinsic = llvm::dyn_cast<llvm::IntrinsicInst>(inst)) {
        if (isIgnorableIntrinsic(intrinsic->getIntrinsicID())) {
            return true;
        }
    }

    if (const auto *call = llvm::dyn_cast<llvm::CallInst>(inst)) {
        const auto *function = call->getCalledFunction();
        if (function && safeFunctions.find(function->getName().str()) !=
                                safeFunctions.end())
            return true;
    }
    return false;
}